

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpCodeUtil.cpp
# Opt level: O1

OpCode Js::OpCodeUtil::DebugConvertProfiledCallToNonProfiled(OpCode op)

{
  code *pcVar1;
  bool bVar2;
  OpCode OVar3;
  undefined4 *puVar4;
  
  if ((ushort)(op - ProfiledCallI) < 8) {
    OVar3 = *(OpCode *)(&DAT_010e719c + (ulong)(ushort)(op - ProfiledCallI) * 2);
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/OpCodeUtil.cpp"
                                ,0x68,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    OVar3 = Nop;
  }
  return OVar3;
}

Assistant:

OpCode OpCodeUtil::DebugConvertProfiledCallToNonProfiled(OpCode op)
    {
        switch (op)
        {
        case Js::OpCode::ProfiledCallI:
        case Js::OpCode::ProfiledCallIWithICIndex:
            return Js::OpCode::CallI;
        case Js::OpCode::ProfiledCallIFlags:
        case Js::OpCode::ProfiledCallIFlagsWithICIndex:
            return Js::OpCode::CallIFlags;
        case Js::OpCode::ProfiledCallIExtendedFlags:
        case Js::OpCode::ProfiledCallIExtendedFlagsWithICIndex:
            return Js::OpCode::CallIExtendedFlags;
        case Js::OpCode::ProfiledCallIExtended:
        case Js::OpCode::ProfiledCallIExtendedWithICIndex:
            return Js::OpCode::CallIExtended;
        default:
            Assert(false);
        };
        return Js::OpCode::Nop;
    }